

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O3

BasicBlock * __thiscall
spvtools::opt::AggressiveDCEPass::GetHeaderBlock(AggressiveDCEPass *this,BasicBlock *blk)

{
  IRContext *this_00;
  StructuredCFGAnalysis *pSVar1;
  Instruction *pIVar2;
  iterator iVar3;
  uint32_t id;
  key_type local_24;
  
  if (blk == (BasicBlock *)0x0) {
    blk = (BasicBlock *)0x0;
  }
  else {
    pIVar2 = BasicBlock::GetLoopMergeInst(blk);
    if (pIVar2 == (Instruction *)0x0) {
      this_00 = (this->super_MemPass).super_Pass.context_;
      if ((this_00->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
        IRContext::BuildStructuredCFGAnalysis(this_00);
      }
      pSVar1 = (this_00->struct_cfg_analysis_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
               .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl;
      pIVar2 = (blk->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      id = 0;
      if (pIVar2->has_result_id_ == true) {
        Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
      }
      iVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(pSVar1->bb_to_construct_)._M_h,&local_24);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_false>
          ._M_cur != (__node_type *)0x0) {
        id = *(uint32_t *)
              ((long)iVar3.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_false>
                     ._M_cur + 0xc);
      }
      blk = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,id);
    }
  }
  return blk;
}

Assistant:

BasicBlock* AggressiveDCEPass::GetHeaderBlock(BasicBlock* blk) const {
  if (blk == nullptr) {
    return nullptr;
  }

  BasicBlock* header_block = nullptr;
  if (blk->IsLoopHeader()) {
    header_block = blk;
  } else {
    uint32_t header =
        context()->GetStructuredCFGAnalysis()->ContainingConstruct(blk->id());
    header_block = context()->get_instr_block(header);
  }
  return header_block;
}